

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int local_1c;
  int pc;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  if ((eVar1 == VTRUE) || (eVar1 - VK < 3)) {
    local_1c = -1;
  }
  else if (eVar1 == VJMP) {
    negatecondition(fs,e);
    local_1c = (e->u).info;
  }
  else if ((e->ravi_type_map & 3) == 0) {
    local_1c = -1;
  }
  else {
    local_1c = jumponcond(fs,e,0);
  }
  luaK_concat(fs,&e->f,local_1c);
  luaK_patchtohere(fs,e->t);
  e->t = -1;
  return;
}

Assistant:

void luaK_goiftrue (FuncState *fs, expdesc *e) {
  int pc;  /* pc of new jump */
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VJMP: {  /* condition? */
      negatecondition(fs, e);  /* jump when it is false */
      pc = e->u.info;  /* save jump position */
      break;
    }
    case VK: case VKFLT: case VKINT: case VTRUE: {
      pc = NO_JUMP;  /* always true; do nothing */
      break;
    }
    default: {
      if (e->ravi_type_map & RAVI_TM_FALSISH) {
        pc = jumponcond(fs, e, 0); /* jump when false */
      }
      else {
        pc = NO_JUMP; /* always true; do nothing */
      }
      break;
    }
  }
  luaK_concat(fs, &e->f, pc);  /* insert new jump in false list */
  luaK_patchtohere(fs, e->t);  /* true list jumps to here (to go through) */
  e->t = NO_JUMP;
}